

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmime_part.c
# Opt level: O1

char * cmime_part_to_string(CMimePart_T *part,char *nl)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  char *pcVar7;
  char *__src;
  CMimeListElem_T *pCVar8;
  char *local_38;
  
  if (part == (CMimePart_T *)0x0) {
    __assert_fail("part",
                  "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/src/cmime_part.c"
                  ,0xb0,"char *cmime_part_to_string(CMimePart_T *, const char *)");
  }
  pcVar7 = part->content;
  if (nl == (char *)0x0) {
    if (pcVar7 == (char *)0x0) {
      pcVar3 = (char *)0x0;
    }
    else {
      pcVar3 = _cmime_internal_determine_linebreak(pcVar7);
    }
    nl = "\r\n";
    if (pcVar3 != (char *)0x0) {
      nl = pcVar3;
    }
  }
  local_38 = (char *)calloc(1,1);
  iVar1 = part->headers->size;
  if (iVar1 != 0) {
    for (pCVar8 = part->headers->head; pCVar8 != (CMimeListElem_T *)0x0; pCVar8 = pCVar8->next) {
      pcVar3 = cmime_header_to_string((CMimeHeader_T *)pCVar8->data);
      sVar4 = strlen(pcVar3);
      sVar5 = strlen(nl);
      iVar2 = strcmp(pcVar3 + (sVar4 - sVar5),nl);
      sVar6 = strlen(local_38);
      if (iVar2 == 0) {
        local_38 = (char *)realloc(local_38,sVar4 + 1 + sVar6);
        __src = pcVar3;
      }
      else {
        local_38 = (char *)realloc(local_38,sVar4 + 1 + sVar5 + sVar6);
        strcat(local_38,pcVar3);
        __src = nl;
      }
      strcat(local_38,__src);
      free(pcVar3);
    }
  }
  if (iVar1 != 0) {
    sVar4 = strlen(local_38);
    sVar5 = strlen(nl);
    local_38 = (char *)realloc(local_38,sVar4 + sVar5 + 2);
    strcat(local_38,nl);
  }
  if (pcVar7 == (char *)0x0) {
    return local_38;
  }
  sVar4 = strlen(local_38);
  sVar5 = strlen(pcVar7);
  pcVar3 = (char *)realloc(local_38,sVar4 + sVar5 + 2);
  pcVar7 = strcat(pcVar3,pcVar7);
  return pcVar7;
}

Assistant:

char *cmime_part_to_string(CMimePart_T *part, const char *nl) {
    char *out = NULL;
    char *content = NULL; 
    char *ptemp = NULL;
    int with_headers = 0;
    CMimeListElem_T *e;
    CMimeHeader_T *h;
    
    assert(part);

    content = cmime_part_get_content(part);
    
    if (nl == NULL) {
        if (content != NULL)
            nl = _cmime_internal_determine_linebreak(content);  
        
        if (nl == NULL)
            nl = CRLF;
    }

    out = (char *)calloc(1,sizeof(char));
    if (cmime_list_size(part->headers)!=0) {
        e = cmime_list_head(part->headers);
        while(e != NULL) {
            h = (CMimeHeader_T *)cmime_list_data(e);
            ptemp = cmime_header_to_string(h);
            /* check whether we have to add a newline, or not */
            if ( strcmp(ptemp + strlen(ptemp) - strlen(nl), nl) == 0) {
                out = (char *)realloc(out,strlen(out) + strlen(ptemp) + 1);
                strcat(out,ptemp);
            } else {
                out = (char *)realloc(out,strlen(out) + strlen(ptemp) + strlen(nl) + 1);
                strcat(out,ptemp);
                strcat(out,nl);
            }
            free(ptemp);
            e = e->next;
        } 
        with_headers = 1; 
    }
    
    if (with_headers==1) {
        out = (char *)realloc(out,strlen(out) + strlen(nl) + 2);
        strcat(out,nl);
    } 

    if (content != NULL) {
        out = (char *)realloc(out,strlen(out) + strlen(content) + 2);
        strcat(out,content);
    }
    return(out);
}